

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,void>
               (basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                *container,ostream *os)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  sVar1 = container->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (container->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if ((sVar3 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), sVar3 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_00319790;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      testing::internal::PrintTo((int)pcVar2[sVar3],os);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    if (sVar1 != 0) {
LAB_00319790:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }